

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O1

ReturnCode macroid(Global *global,int *c)

{
  char cVar1;
  ReturnCode RVar2;
  uint uVar3;
  ulong uVar4;
  DEFBUF *tokenp;
  
  if ((global->infile != (FILEINFO *)0x0) && (global->infile->fp != (FILE *)0x0)) {
    global->recursion = 0;
  }
  uVar4 = (ulong)*c;
  cVar1 = type[uVar4];
  while (((RVar2 = FPP_OK, cVar1 == '\x02' &&
          (tokenp = lookid(global,(int)uVar4), RVar2 = FPP_OK, tokenp != (DEFBUF *)0x0)) &&
         (RVar2 = expand(global,tokenp), RVar2 == FPP_OK))) {
    uVar3 = get(global);
    uVar4 = (ulong)uVar3;
    *c = uVar3;
    cVar1 = type[uVar3];
  }
  return RVar2;
}

Assistant:

ReturnCode macroid(struct Global *global, int *c)
{
  /*
   * If c is a letter, scan the id.  if it's #defined, expand it and scan
   * the next character and try again.
   *
   * Else, return the character. If type[c] is a LET, the token is in tokenbuf.
   */
  DEFBUF *dp;
  ReturnCode ret=FPP_OK;
  
  if (global->infile != NULL && global->infile->fp != NULL)
    global->recursion = 0;
  while (type[*c] == LET && (dp = lookid(global, *c)) != NULL) {
    if((ret=expand(global, dp)))
      return(ret);
    *c = get(global);
  }
  return(FPP_OK);
}